

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_value * sqlite3VdbeGetBoundValue(Vdbe *v,int iVar,u8 aff)

{
  Mem *pMVar1;
  sqlite3_value *pTo;
  
  if (v != (Vdbe *)0x0) {
    pMVar1 = v->aVar;
    if (((pMVar1[(long)iVar + -1].flags & 1) == 0) &&
       (pTo = sqlite3ValueNew(v->db), pTo != (sqlite3_value *)0x0)) {
      sqlite3VdbeMemCopy(pTo,pMVar1 + (long)iVar + -1);
      return pTo;
    }
  }
  return (sqlite3_value *)0x0;
}

Assistant:

SQLITE_PRIVATE sqlite3_value *sqlite3VdbeGetBoundValue(Vdbe *v, int iVar, u8 aff){
  assert( iVar>0 );
  if( v ){
    Mem *pMem = &v->aVar[iVar-1];
    assert( (v->db->flags & SQLITE_EnableQPSG)==0
         || (v->db->mDbFlags & DBFLAG_InternalFunc)!=0 );
    if( 0==(pMem->flags & MEM_Null) ){
      sqlite3_value *pRet = sqlite3ValueNew(v->db);
      if( pRet ){
        sqlite3VdbeMemCopy((Mem *)pRet, pMem);
        sqlite3ValueApplyAffinity(pRet, aff, SQLITE_UTF8);
      }
      return pRet;
    }
  }
  return 0;
}